

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O0

uint embree::createClothSheet(RTCScene scene)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  void *__s;
  pointer pCVar5;
  reference pvVar6;
  reference puVar7;
  long *plVar8;
  type pCVar9;
  size_type sVar10;
  pointer in_RDI;
  uint geomID;
  RTCGeometry geom;
  DistanceConstraint *c;
  unsigned_long id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sIDs;
  size_t j_1;
  size_t i_1;
  size_t vID;
  size_t j;
  size_t i;
  vec_t gravity;
  vec_t nullvec;
  unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_> cloth
  ;
  pointer in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe30;
  unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *this;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  vector<Triangle,_std::allocator<Triangle>_> *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe48;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *in_stack_fffffffffffffe50;
  ClothModel *cloth_00;
  unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  local_168;
  uint local_15c;
  unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *local_158;
  long *local_150;
  long *local_148;
  unsigned_long local_140;
  unsigned_long *local_138;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_130;
  undefined1 *local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  undefined1 local_100 [24];
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined4 local_bc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 local_a8 [32];
  pointer local_80;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  pointer local_68;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_50;
  pointer local_48;
  pointer pVStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  pointer local_28;
  pointer pVStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_80 = in_RDI;
  __s = ::operator_new(0x118);
  memset(__s,0,0x118);
  collide2::ClothModel::ClothModel
            ((ClothModel *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  cloth_00 = (ClothModel *)&stack0xffffffffffffff78;
  std::unique_ptr<embree::collide2::ClothModel,std::default_delete<embree::collide2::ClothModel>>::
  unique_ptr<std::default_delete<embree::collide2::ClothModel>,void>
            ((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
              *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18);
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x140fcd);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x141000);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x141033);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x141066);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_68 = (pointer)local_a8;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_4 = 0;
  local_8 = 0;
  local_c = 0;
  local_10 = 0;
  local_28 = (pointer)0x0;
  pVStack_20 = (pointer)0x0;
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_8_ = 0;
  local_50 = &local_b8;
  local_54 = 0;
  local_58 = 0xc11ccccd;
  local_5c = 0;
  local_2c = 0;
  local_30 = 0;
  local_34 = 0xc11ccccd;
  local_38 = 0;
  local_48 = (pointer)0xc11ccccd00000000;
  pVStack_40 = (pointer)0x0;
  local_b8._0_8_ = 0xc11ccccd00000000;
  local_b8._8_8_ = 0;
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x14120f);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (value_type *)in_stack_fffffffffffffe40);
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x14124a);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (value_type *)in_stack_fffffffffffffe40);
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x141288);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,(value_type_conflict *)in_stack_fffffffffffffe40);
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x1412c5);
  local_bc = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,(value_type_conflict *)in_stack_fffffffffffffe40);
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                *)0x14130e);
  std::vector<Triangle,_std::allocator<Triangle>_>::resize
            (in_stack_fffffffffffffe40,CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
            );
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::operator*((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  initializeClothPositions(cloth_00);
  for (local_c8 = 0; local_c8 < NX - 1U; local_c8 = local_c8 + 1) {
    for (local_d0 = 0; local_d0 < NZ - 1; local_d0 = local_d0 + 1) {
      iVar2 = (int)local_c8;
      iVar3 = (int)NZ;
      iVar1 = (int)local_d0;
      pCVar5 = std::
               unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                             *)0x1413df);
      pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&(pCVar5->super_Mesh).tris_,(local_c8 * (NZ - 1) + local_d0) * 2);
      pvVar6->v0 = iVar2 * iVar3 + iVar1;
      iVar2 = (int)local_c8;
      iVar3 = (int)NZ;
      iVar1 = (int)local_d0;
      pCVar5 = std::
               unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                             *)0x141446);
      pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&(pCVar5->super_Mesh).tris_,(local_c8 * (NZ - 1) + local_d0) * 2);
      pvVar6->v1 = iVar2 * iVar3 + iVar1 + 1;
      iVar3 = (int)local_c8;
      iVar2 = (int)NZ;
      iVar1 = (int)local_d0;
      pCVar5 = std::
               unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                             *)0x1414b2);
      pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&(pCVar5->super_Mesh).tris_,(local_c8 * (NZ - 1) + local_d0) * 2);
      pvVar6->v2 = (iVar3 + 1) * iVar2 + iVar1 + 1;
      iVar3 = (int)local_c8;
      iVar2 = (int)NZ;
      iVar1 = (int)local_d0;
      pCVar5 = std::
               unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                             *)0x14151e);
      pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&(pCVar5->super_Mesh).tris_,(local_c8 * (NZ - 1) + local_d0) * 2 + 1);
      pvVar6->v0 = (iVar3 + 1) * iVar2 + iVar1 + 1;
      iVar3 = (int)local_c8;
      iVar2 = (int)NZ;
      iVar1 = (int)local_d0;
      pCVar5 = std::
               unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                             *)0x141589);
      pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&(pCVar5->super_Mesh).tris_,(local_c8 * (NZ - 1) + local_d0) * 2 + 1);
      pvVar6->v1 = (iVar3 + 1) * iVar2 + iVar1;
      iVar2 = (int)local_c8;
      iVar3 = (int)NZ;
      iVar1 = (int)local_d0;
      pCVar5 = std::
               unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                             *)0x1415f1);
      pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&(pCVar5->super_Mesh).tris_,(local_c8 * (NZ - 1) + local_d0) * 2 + 1);
      pvVar6->v2 = iVar2 * iVar3 + iVar1;
    }
  }
  pCVar5 = std::
           unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
           ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                         *)0x141687);
  pCVar5->k_stretch_ = 4000.0;
  pCVar5 = std::
           unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
           ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                         *)0x1416a4);
  pCVar5->k_damp_ = 0.2;
  for (local_d8 = 0; local_d8 < NX * NZ; local_d8 = local_d8 + 1) {
    local_e0 = local_d8 / NZ;
    local_e8 = local_d8 % NZ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14172b);
    if (local_e0 < NX - 1U) {
      local_108 = local_d8 + NZ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (value_type_conflict1 *)in_stack_fffffffffffffe18);
    }
    if (local_e8 < NZ - 1) {
      local_110 = local_d8 + 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (value_type_conflict1 *)in_stack_fffffffffffffe18);
    }
    if ((local_e0 < NX - 1U) && (local_e8 < NZ - 1)) {
      local_118 = local_d8 + 1 + NZ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (value_type_conflict1 *)in_stack_fffffffffffffe18);
    }
    if ((local_e0 != 0) && (local_e8 < NZ - 1)) {
      local_120 = (local_d8 - NZ) + 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (value_type_conflict1 *)in_stack_fffffffffffffe18);
    }
    local_128 = local_100;
    local_130._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffe18);
    local_138 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffe18);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffe18), bVar4) {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_130);
      local_140 = *puVar7;
      plVar8 = (long *)::operator_new(0x28);
      collide2::DistanceConstraint::DistanceConstraint
                ((DistanceConstraint *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                );
      local_148 = plVar8;
      pCVar9 = std::
               unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
               ::operator*((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                            *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      (**(code **)(*plVar8 + 0x18))(plVar8,pCVar9,local_d8,local_140);
      std::
      unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>::
      operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                  *)0x14199a);
      local_150 = local_148;
      std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>::
      push_back((vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
                 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                (value_type *)in_stack_fffffffffffffe18);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_130);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe30);
  }
  local_158 = (unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
              rtcNewGeometry(g_device,0x78);
  local_15c = rtcAttachGeometry(local_80,local_158);
  this = local_158;
  pCVar5 = std::
           unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
           ::operator->((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                         *)0x141a97);
  sVar10 = std::vector<Triangle,_std::allocator<Triangle>_>::size(&(pCVar5->super_Mesh).tris_);
  rtcSetGeometryUserPrimitiveCount(this,sVar10 & 0xffffffff);
  rtcSetGeometryUserData(local_158,local_15c);
  rtcSetGeometryBoundsFunction(local_158,triangle_bounds_func,0);
  rtcSetGeometryIntersectFunction(local_158,triangle_intersect_func);
  rtcCommitGeometry(local_158);
  rtcReleaseGeometry(local_158);
  std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>::
  unique_ptr<embree::collide2::ClothModel,std::default_delete<embree::collide2::ClothModel>,void>
            (this,&local_168);
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
  ::push_back((vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
              (value_type *)in_stack_fffffffffffffe18);
  std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::~unique_ptr
            (this);
  std::unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
  ::~unique_ptr((unique_ptr<embree::collide2::ClothModel,_std::default_delete<embree::collide2::ClothModel>_>
                 *)CONCAT44(local_15c,in_stack_fffffffffffffe20));
  return local_15c;
}

Assistant:

unsigned int createClothSheet (RTCScene scene)
{
  std::unique_ptr<collide2::ClothModel> cloth (new collide2::ClothModel());
  cloth->x_0_.resize (NX*NZ);
  cloth->x_.resize (NX*NZ);
  cloth->x_old_.resize (NX*NZ);
  cloth->x_last_.resize (NX*NZ);
  collide2::vec_t nullvec(0.f, 0.f, 0.f);
  collide2::vec_t gravity(0.f, -9.8f, 0.f);
  cloth->v_.resize (NX*NZ, nullvec);
  cloth->a_.resize (NX*NZ, gravity);
  cloth->m_.resize (NX*NZ, m);
  cloth->m_inv_.resize (NX*NZ, 1.f / m);
  cloth->tris_.resize (2*(NX-1)*(NZ-1));

  initializeClothPositions (*cloth);

  // init topology
  for (size_t i=0; i<NX-1; ++i) {
    for (size_t j=0; j<NZ-1; ++j) {
      cloth->tris_[2*(i*(NZ-1)+j)].v0 = i*NZ+j;
      cloth->tris_[2*(i*(NZ-1)+j)].v1 = i*NZ+j+1;
      cloth->tris_[2*(i*(NZ-1)+j)].v2 = (i+1)*NZ+j+1;

      cloth->tris_[2*(i*(NZ-1)+j)+1].v0 = (i+1)*NZ+j+1;
      cloth->tris_[2*(i*(NZ-1)+j)+1].v1 = (i+1)*NZ+j;
      cloth->tris_[2*(i*(NZ-1)+j)+1].v2 = i*NZ+j;
    }
  }

  cloth->k_stretch_ = ks;
  cloth->k_damp_ = damping;

  // set distance constraints
  for (size_t vID=0; vID<NX*NZ; ++vID) {
    
    size_t i = vID/NZ;
    size_t j = vID%NZ;

    std::vector<size_t> sIDs;

    if (i<NX-1) sIDs.push_back (vID+NZ);
    if (j<NZ-1) sIDs.push_back (vID+1);

    if (i<NX-1) {
      if (j<NZ-1) {
        sIDs.push_back (vID+NZ+1);
      }
    }

    if (i>0) {
      if (j<NZ-1) {
        sIDs.push_back (vID-NZ+1);
      }
    }

    for (auto id : sIDs) {
      auto c = new collide2::DistanceConstraint ();
      c->initConstraint (*cloth, vID, id);
      cloth->m_constraints_.push_back (c);
    }
  }

  // fix corners
  // cloth->m_[0] = 0.f;
  // cloth->m_[(NX-1)*NZ] = 0.f;
  // cloth->m_[(NX-1)*NZ + NZ-1] = 0.f;
  // cloth->m_[NZ-1] = 0.f;
  // cloth->m_inv_[0] = 0.f;
  // cloth->m_inv_[(NX-1)*NZ] = 0.f;
  // cloth->m_inv_[(NX-1)*NZ + NZ-1] = 0.f;
  // cloth->m_inv_[NZ-1] = 0.f;
  // cloth->a_[0].y = 0.f;
  // cloth->a_[(NX-1)*NZ].y = 0.f;
  // cloth->a_[(NX-1)*NZ + NZ-1].y = 0.f;
  // cloth->a_[NZ-1].y = 0.f;

  // if (use_user_geometry) {
    RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_USER);
    unsigned int geomID = rtcAttachGeometry(scene,geom);
    rtcSetGeometryUserPrimitiveCount(geom, cloth->tris_.size());
    rtcSetGeometryUserData(geom,(void*)(size_t)geomID);
    rtcSetGeometryBoundsFunction   (geom, triangle_bounds_func, nullptr);
    rtcSetGeometryIntersectFunction(geom, triangle_intersect_func);
    rtcCommitGeometry(geom);
    rtcReleaseGeometry(geom);
    meshes.push_back (std::move (cloth));
    return geomID;
  // } else {
  //   RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  //   rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, cloth->x_.data(), 0, sizeof(collide2::vec_t), cloth->x_.size());
  //   rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX , 0, RTC_FORMAT_UINT3,  cloth->tris_.data(), 0, sizeof(Triangle), cloth->tris_.size());
  //   rtcCommitGeometry(geom);
  //   unsigned int geomID = rtcAttachGeometry(scene,geom);
  //   rtcReleaseGeometry(geom);
  //   meshes.push_back (std::move (cloth));
  //   return geomID;
  // }
}